

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86.cpp
# Opt level: O0

int __thiscall ncnn::TanH_x86::forward_inplace(TanH_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float *pfVar13;
  long in_RSI;
  int iVar14;
  double dVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  __m128 two_1;
  __m128 one_3;
  __m128 two;
  __m128 one;
  __m128 one_1;
  __m128 one_4;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf z_1;
  v4sf mask_1;
  v4sf one_5;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y;
  v4sf z;
  v4sf mask;
  v4sf one_2;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  undefined8 local_d38;
  float fStack_d30;
  undefined4 in_stack_fffffffffffff2d8;
  int in_stack_fffffffffffff2dc;
  Mat local_d20;
  float *local_cd8;
  int local_ccc;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  int local_cb0;
  Mat local_ca0;
  float *local_c58;
  int local_c50;
  int local_c4c;
  int local_c48;
  int local_c44;
  int local_c40;
  int local_c3c;
  float *local_c18;
  float *local_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  float *local_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  float *local_b70;
  undefined4 local_b68;
  undefined4 uStack_b64;
  undefined4 uStack_b60;
  undefined4 uStack_b5c;
  undefined4 local_b4c;
  undefined4 local_b48;
  undefined4 uStack_b44;
  undefined4 uStack_b40;
  undefined4 uStack_b3c;
  undefined4 local_b2c;
  undefined4 local_b28;
  undefined4 uStack_b24;
  undefined4 uStack_b20;
  undefined4 uStack_b1c;
  undefined4 local_b0c;
  undefined4 local_b08;
  undefined4 uStack_b04;
  undefined4 uStack_b00;
  undefined4 uStack_afc;
  undefined4 local_aec;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined1 local_a98 [8];
  float fStack_a90;
  float fStack_a8c;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined1 local_a58 [8];
  float fStack_a50;
  float fStack_a4c;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  undefined4 local_a08;
  undefined4 uStack_a04;
  undefined4 uStack_a00;
  undefined4 uStack_9fc;
  undefined4 local_9ec;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  undefined4 local_9a8;
  undefined4 uStack_9a4;
  undefined4 uStack_9a0;
  undefined4 uStack_99c;
  undefined4 local_98c;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  undefined8 local_958;
  undefined8 uStack_950;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  uVar3 = _fStack_d30;
  local_c3c = *(int *)(in_RSI + 0x2c);
  local_c40 = *(int *)(in_RSI + 0x30);
  local_c44 = *(int *)(in_RSI + 0x38);
  local_c48 = local_c3c * local_c40;
  local_c4c = *(int *)(in_RSI + 0x18);
  if (local_c4c == 4) {
    local_c4c = 4;
    for (local_c50 = 0; local_c50 < local_c44; local_c50 = local_c50 + 1) {
      iVar14 = (int)((ulong)uVar3 >> 0x20);
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),iVar14
                        );
      pfVar13 = ncnn::Mat::operator_cast_to_float_(&local_ca0);
      ncnn::Mat::~Mat((Mat *)0x513a79);
      local_c58 = pfVar13;
      for (local_cb0 = 0; local_cb0 < local_c48; local_cb0 = local_cb0 + 1) {
        local_c10 = local_c58;
        local_bb8 = *(undefined8 *)local_c58;
        uStack_bb0 = *(undefined8 *)(local_c58 + 2);
        local_b2c = 0x3f800000;
        local_b48 = 0x3f800000;
        local_bc8 = 0x3f8000003f800000;
        uStack_bc0 = 0x3f8000003f800000;
        local_b4c = 0x40000000;
        local_b68 = 0x40000000;
        local_bd8 = 0x4000000040000000;
        uStack_bd0 = 0x4000000040000000;
        local_a78._0_4_ = (float)local_bb8;
        local_a78._4_4_ = (float)((ulong)local_bb8 >> 0x20);
        uStack_a70._0_4_ = (float)uStack_bb0;
        uStack_a70._4_4_ = (float)((ulong)uStack_bb0 >> 0x20);
        local_a18 = (float)local_a78 * 2.0;
        fStack_a14 = local_a78._4_4_ * 2.0;
        fStack_a10 = (float)uStack_a70 * 2.0;
        fStack_a0c = uStack_a70._4_4_ * 2.0;
        local_9ec = 0x3f800000;
        local_a08 = 0x3f800000;
        local_a28 = 0x3f8000003f800000;
        uStack_a20 = 0x3f8000003f800000;
        local_218 = 0;
        uStack_210 = 0;
        local_9d8 = 0;
        uStack_9d0 = 0;
        local_9e8 = CONCAT44(fStack_a14,local_a18);
        uStack_9e0 = CONCAT44(fStack_a0c,fStack_a10);
        local_518 = CONCAT44(0.0 - fStack_a14,0.0 - local_a18);
        uStack_510._0_4_ = 0.0 - fStack_a10;
        uStack_510._4_4_ = 0.0 - fStack_a0c;
        local_248 = 0;
        uStack_240 = 0;
        local_558 = 0x3f8000003f800000;
        uStack_550 = 0x3f8000003f800000;
        local_1f8 = local_518;
        uStack_1f0 = uStack_510;
        local_208 = 0x42b0c0a542b0c0a5;
        uStack_200 = 0x42b0c0a542b0c0a5;
        auVar8._8_8_ = uStack_510;
        auVar8._0_8_ = local_518;
        auVar7._8_8_ = 0x42b0c0a542b0c0a5;
        auVar7._0_8_ = 0x42b0c0a542b0c0a5;
        auVar16 = minps(auVar8,auVar7);
        local_518 = auVar16._0_8_;
        local_1b8 = local_518;
        uStack_510 = auVar16._8_8_;
        uStack_1b0 = uStack_510;
        local_1c8 = 0xc2b0c0a5c2b0c0a5;
        uStack_1c0 = 0xc2b0c0a5c2b0c0a5;
        auVar11._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar11._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar16 = maxps(auVar16,auVar11);
        local_518 = auVar16._0_8_;
        uVar1 = local_518;
        uStack_510 = auVar16._8_8_;
        uVar2 = uStack_510;
        local_368 = 0x3fb8aa3b3fb8aa3b;
        uStack_360 = 0x3fb8aa3b3fb8aa3b;
        local_358._0_4_ = auVar16._0_4_;
        local_358._4_4_ = auVar16._4_4_;
        uStack_350._0_4_ = auVar16._8_4_;
        uStack_350._4_4_ = auVar16._12_4_;
        local_258 = CONCAT44(local_358._4_4_ * 1.442695,(float)local_358 * 1.442695);
        uStack_250 = CONCAT44(uStack_350._4_4_ * 1.442695,(float)uStack_350 * 1.442695);
        local_308 = 0x3f0000003f000000;
        uStack_300 = 0x3f0000003f000000;
        fVar17 = (float)local_358 * 1.442695 + 0.5;
        fVar18 = local_358._4_4_ * 1.442695 + 0.5;
        fVar19 = (float)uStack_350 * 1.442695 + 0.5;
        fVar20 = uStack_350._4_4_ * 1.442695 + 0.5;
        local_178 = CONCAT44(fVar18,fVar17);
        uStack_170 = CONCAT44(fVar20,fVar19);
        local_148 = CONCAT44((int)fVar18,(int)fVar17);
        uStack_140 = CONCAT44((int)fVar20,(int)fVar19);
        local_538 = (float)(int)fVar17;
        fStack_534 = (float)(int)fVar18;
        fStack_530 = (float)(int)fVar19;
        fStack_52c = (float)(int)fVar20;
        local_528 = CONCAT44(fStack_534,local_538);
        uStack_520 = CONCAT44(fStack_52c,fStack_530);
        local_118 = local_528;
        uStack_110 = uStack_520;
        local_128 = CONCAT44(fVar18,fVar17);
        uStack_120 = CONCAT44(fVar20,fVar19);
        local_568 = CONCAT44(-(uint)(fVar18 < fStack_534),-(uint)(fVar17 < local_538));
        uStack_560 = CONCAT44(-(uint)(fVar20 < fStack_52c),-(uint)(fVar19 < fStack_530));
        local_d8 = local_568;
        uStack_d0 = uStack_560;
        local_e8 = 0x3f8000003f800000;
        uStack_e0 = 0x3f8000003f800000;
        local_568 = local_568 & 0x3f8000003f800000;
        uStack_560 = uStack_560 & 0x3f8000003f800000;
        local_4b8 = local_528;
        uStack_4b0 = uStack_520;
        local_4c8._0_4_ = (float)local_568;
        local_4c8._4_4_ = (float)(local_568 >> 0x20);
        uStack_4c0._0_4_ = (float)uStack_560;
        uStack_4c0._4_4_ = (float)(uStack_560 >> 0x20);
        local_538 = local_538 - (float)local_4c8;
        fStack_534 = fStack_534 - local_4c8._4_4_;
        fStack_530 = fStack_530 - (float)uStack_4c0;
        fStack_52c = fStack_52c - uStack_4c0._4_4_;
        local_378 = CONCAT44(fStack_534,local_538);
        uStack_370 = CONCAT44(fStack_52c,fStack_530);
        local_388 = 0x3f3180003f318000;
        uStack_380 = 0x3f3180003f318000;
        local_528 = CONCAT44(fStack_534 * 0.6933594,local_538 * 0.6933594);
        uStack_520 = CONCAT44(fStack_52c * 0.6933594,fStack_530 * 0.6933594);
        local_398 = CONCAT44(fStack_534,local_538);
        uStack_390 = CONCAT44(fStack_52c,fStack_530);
        local_3a8 = 0xb95e8083b95e8083;
        uStack_3a0 = 0xb95e8083b95e8083;
        local_4d8 = local_518;
        uStack_4d0 = uStack_510;
        local_4e8 = local_528;
        uStack_4e0 = uStack_520;
        local_358._0_4_ = (float)local_358 - local_538 * 0.6933594;
        local_358._4_4_ = local_358._4_4_ - fStack_534 * 0.6933594;
        uStack_350._0_4_ = (float)uStack_350 - fStack_530 * 0.6933594;
        uStack_350._4_4_ = uStack_350._4_4_ - fStack_52c * 0.6933594;
        local_518 = CONCAT44(local_358._4_4_,(float)local_358);
        uStack_510._0_4_ = (float)uStack_350;
        uStack_510._4_4_ = uStack_350._4_4_;
        local_4f8 = local_518;
        uStack_4f0 = uStack_510;
        local_508 = CONCAT44(fStack_534 * -0.00021219444,local_538 * -0.00021219444);
        uStack_500 = CONCAT44(fStack_52c * -0.00021219444,fStack_530 * -0.00021219444);
        local_358._0_4_ = (float)local_358 - local_538 * -0.00021219444;
        local_358._4_4_ = local_358._4_4_ - fStack_534 * -0.00021219444;
        uStack_350._0_4_ = (float)uStack_350 - fStack_530 * -0.00021219444;
        uStack_350._4_4_ = uStack_350._4_4_ - fStack_52c * -0.00021219444;
        local_518 = CONCAT44(local_358._4_4_,(float)local_358);
        uStack_510._0_4_ = (float)uStack_350;
        uStack_510._4_4_ = uStack_350._4_4_;
        local_3c8 = local_518;
        uStack_3c0 = uStack_510;
        local_578 = (float)local_358 * (float)local_358;
        fStack_574 = local_358._4_4_ * local_358._4_4_;
        fStack_570 = (float)uStack_350 * (float)uStack_350;
        fStack_56c = uStack_350._4_4_ * uStack_350._4_4_;
        local_3d8 = 0x3950696739506967;
        uStack_3d0 = 0x3950696739506967;
        local_3e8 = local_518;
        uStack_3e0 = uStack_510;
        local_588 = CONCAT44(local_358._4_4_ * 0.00019875691,(float)local_358 * 0.00019875691);
        uStack_580 = CONCAT44(uStack_350._4_4_ * 0.00019875691,(float)uStack_350 * 0.00019875691);
        local_278 = local_588;
        uStack_270 = uStack_580;
        local_288 = 0x3ab743ce3ab743ce;
        uStack_280 = 0x3ab743ce3ab743ce;
        local_948 = (float)local_358 * 0.00019875691 + 0.0013981999;
        fStack_944 = local_358._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_940 = (float)uStack_350 * 0.00019875691 + 0.0013981999;
        fStack_93c = uStack_350._4_4_ * 0.00019875691 + 0.0013981999;
        local_588 = CONCAT44(fStack_944,local_948);
        uStack_580 = CONCAT44(fStack_93c,fStack_940);
        local_3f8 = local_588;
        uStack_3f0 = uStack_580;
        local_408 = local_518;
        uStack_400 = uStack_510;
        local_948 = local_948 * (float)local_358;
        fStack_944 = fStack_944 * local_358._4_4_;
        fStack_940 = fStack_940 * (float)uStack_350;
        fStack_93c = fStack_93c * uStack_350._4_4_;
        local_588 = CONCAT44(fStack_944,local_948);
        uStack_580 = CONCAT44(fStack_93c,fStack_940);
        local_298 = local_588;
        uStack_290 = uStack_580;
        local_2a8 = 0x3c0889083c088908;
        uStack_2a0 = 0x3c0889083c088908;
        local_948 = local_948 + 0.008333452;
        fStack_944 = fStack_944 + 0.008333452;
        fStack_940 = fStack_940 + 0.008333452;
        fStack_93c = fStack_93c + 0.008333452;
        local_588 = CONCAT44(fStack_944,local_948);
        uStack_580 = CONCAT44(fStack_93c,fStack_940);
        local_418 = local_588;
        uStack_410 = uStack_580;
        local_428 = local_518;
        uStack_420 = uStack_510;
        local_948 = local_948 * (float)local_358;
        fStack_944 = fStack_944 * local_358._4_4_;
        fStack_940 = fStack_940 * (float)uStack_350;
        fStack_93c = fStack_93c * uStack_350._4_4_;
        local_588 = CONCAT44(fStack_944,local_948);
        uStack_580 = CONCAT44(fStack_93c,fStack_940);
        local_2b8 = local_588;
        uStack_2b0 = uStack_580;
        local_2c8 = 0x3d2aa9c13d2aa9c1;
        uStack_2c0 = 0x3d2aa9c13d2aa9c1;
        local_948 = local_948 + 0.041665796;
        fStack_944 = fStack_944 + 0.041665796;
        fStack_940 = fStack_940 + 0.041665796;
        fStack_93c = fStack_93c + 0.041665796;
        local_588 = CONCAT44(fStack_944,local_948);
        uStack_580 = CONCAT44(fStack_93c,fStack_940);
        local_438 = local_588;
        uStack_430 = uStack_580;
        local_448 = local_518;
        uStack_440 = uStack_510;
        local_948 = local_948 * (float)local_358;
        fStack_944 = fStack_944 * local_358._4_4_;
        fStack_940 = fStack_940 * (float)uStack_350;
        fStack_93c = fStack_93c * uStack_350._4_4_;
        local_588 = CONCAT44(fStack_944,local_948);
        uStack_580 = CONCAT44(fStack_93c,fStack_940);
        local_2d8 = local_588;
        uStack_2d0 = uStack_580;
        local_2e8 = 0x3e2aaaaa3e2aaaaa;
        uStack_2e0 = 0x3e2aaaaa3e2aaaaa;
        local_948 = local_948 + 0.16666666;
        fStack_944 = fStack_944 + 0.16666666;
        fStack_940 = fStack_940 + 0.16666666;
        fStack_93c = fStack_93c + 0.16666666;
        local_588 = CONCAT44(fStack_944,local_948);
        uStack_580 = CONCAT44(fStack_93c,fStack_940);
        local_458 = local_588;
        uStack_450 = uStack_580;
        local_468 = local_518;
        uStack_460 = uStack_510;
        local_948 = local_948 * (float)local_358;
        fStack_944 = fStack_944 * local_358._4_4_;
        fStack_940 = fStack_940 * (float)uStack_350;
        fStack_93c = fStack_93c * uStack_350._4_4_;
        local_588 = CONCAT44(fStack_944,local_948);
        uStack_580 = CONCAT44(fStack_93c,fStack_940);
        local_2f8 = local_588;
        uStack_2f0 = uStack_580;
        local_948 = local_948 + 0.5;
        fStack_944 = fStack_944 + 0.5;
        fStack_940 = fStack_940 + 0.5;
        fStack_93c = fStack_93c + 0.5;
        local_588 = CONCAT44(fStack_944,local_948);
        uStack_580 = CONCAT44(fStack_93c,fStack_940);
        local_478 = local_588;
        uStack_470 = uStack_580;
        local_488 = CONCAT44(fStack_574,local_578);
        uStack_480 = CONCAT44(fStack_56c,fStack_570);
        local_948 = local_948 * local_578;
        fStack_944 = fStack_944 * fStack_574;
        fStack_940 = fStack_940 * fStack_570;
        fStack_93c = fStack_93c * fStack_56c;
        local_588 = CONCAT44(fStack_944,local_948);
        uStack_580 = CONCAT44(fStack_93c,fStack_940);
        local_318 = local_588;
        uStack_310 = uStack_580;
        local_328 = local_518;
        uStack_320 = uStack_510;
        local_948 = local_948 + (float)local_358;
        fStack_944 = fStack_944 + local_358._4_4_;
        fStack_940 = fStack_940 + (float)uStack_350;
        fStack_93c = fStack_93c + uStack_350._4_4_;
        local_588 = CONCAT44(fStack_944,local_948);
        uStack_580 = CONCAT44(fStack_93c,fStack_940);
        local_338 = local_588;
        uStack_330 = uStack_580;
        local_348 = 0x3f8000003f800000;
        uStack_340 = 0x3f8000003f800000;
        local_948 = local_948 + 1.0;
        fStack_944 = fStack_944 + 1.0;
        fStack_940 = fStack_940 + 1.0;
        fStack_93c = fStack_93c + 1.0;
        local_588 = CONCAT44(fStack_944,local_948);
        uStack_580 = CONCAT44(fStack_93c,fStack_940);
        local_188 = CONCAT44(fStack_534,local_538);
        uStack_180 = CONCAT44(fStack_52c,fStack_530);
        local_98 = CONCAT44((int)fStack_534,(int)local_538);
        uStack_90 = CONCAT44((int)fStack_52c,(int)fStack_530);
        local_a8 = 0x7f0000007f;
        uStack_a0 = 0x7f0000007f;
        iVar14 = (int)local_538 + 0x7f;
        fStack_544 = (float)((int)fStack_534 + 0x7f);
        fStack_540 = (float)((int)fStack_530 + 0x7f);
        fStack_53c = (float)((int)fStack_52c + 0x7f);
        local_58 = CONCAT44(fStack_544,iVar14);
        uStack_50 = CONCAT44(fStack_53c,fStack_540);
        local_5c = 0x17;
        local_548 = (float)(iVar14 * 0x800000);
        local_598 = CONCAT44(fStack_544,local_548);
        uStack_590 = CONCAT44(fStack_53c,fStack_540);
        local_498 = local_588;
        uStack_490 = uStack_580;
        local_948 = local_948 * local_548;
        fStack_944 = fStack_944 * fStack_544;
        fStack_940 = fStack_940 * fStack_540;
        fStack_93c = fStack_93c * fStack_53c;
        local_588 = CONCAT44(fStack_944,local_948);
        uStack_580 = CONCAT44(fStack_93c,fStack_940);
        local_908 = local_588;
        uStack_900 = uStack_580;
        local_948 = local_948 + 1.0;
        fStack_944 = fStack_944 + 1.0;
        fStack_940 = fStack_940 + 1.0;
        fStack_93c = fStack_93c + 1.0;
        auVar6._8_8_ = 0x3f8000003f800000;
        auVar6._0_8_ = 0x3f8000003f800000;
        auVar5._4_4_ = fStack_944;
        auVar5._0_4_ = local_948;
        auVar5._8_4_ = fStack_940;
        auVar5._12_4_ = fStack_93c;
        _local_a98 = divps(auVar6,auVar5);
        local_ad8 = (float)local_a98._0_4_ * 2.0;
        fStack_ad4 = (float)local_a98._4_4_ * 2.0;
        fStack_ad0 = fStack_a90 * 2.0;
        fStack_acc = fStack_a8c * 2.0;
        local_cc8 = CONCAT44(fStack_ad4 - 1.0,local_ad8 - 1.0);
        uStack_cc0 = CONCAT44(fStack_acc - 1.0,fStack_ad0 - 1.0);
        local_b70 = local_c58;
        local_b88 = local_cc8;
        uStack_b80 = uStack_cc0;
        *(undefined8 *)local_c58 = local_cc8;
        *(undefined8 *)(local_c58 + 2) = uStack_cc0;
        local_c58 = local_c58 + 4;
        uStack_b64 = local_b68;
        uStack_b60 = local_b68;
        uStack_b5c = local_b68;
        uStack_b44 = local_b48;
        uStack_b40 = local_b48;
        uStack_b3c = local_b48;
        local_ae8 = local_bc8;
        uStack_ae0 = uStack_bc0;
        local_aa8 = local_bd8;
        uStack_aa0 = uStack_bd0;
        local_a88 = local_bd8;
        uStack_a80 = uStack_bd0;
        local_a78 = local_bb8;
        uStack_a70 = uStack_bb0;
        uStack_a04 = local_a08;
        uStack_a00 = local_a08;
        uStack_9fc = local_a08;
        local_938 = local_a28;
        uStack_930 = uStack_a20;
        local_8f8 = local_a28;
        uStack_8f0 = uStack_a20;
        local_4c8 = local_568;
        uStack_4c0 = uStack_560;
        local_4a8 = local_598;
        uStack_4a0 = uStack_590;
        local_3b8 = local_3c8;
        uStack_3b0 = uStack_3c0;
        local_358 = uVar1;
        uStack_350 = uVar2;
        local_268 = local_308;
        uStack_260 = uStack_300;
        local_28 = local_598;
        uStack_20 = uStack_590;
      }
    }
  }
  else {
    for (local_ccc = 0; uVar3 = _fStack_d30, local_ccc < local_c44; local_ccc = local_ccc + 1) {
      iVar14 = (int)((ulong)_fStack_d30 >> 0x20);
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),iVar14
                        );
      pfVar13 = ncnn::Mat::operator_cast_to_float_(&local_d20);
      ncnn::Mat::~Mat((Mat *)0x5144af);
      _fStack_d30 = uVar3;
      local_cd8 = pfVar13;
      for (in_stack_fffffffffffff2dc = 0; in_stack_fffffffffffff2dc + 3 < local_c48;
          in_stack_fffffffffffff2dc = in_stack_fffffffffffff2dc + 4) {
        local_c18 = local_cd8;
        local_be8 = *(undefined8 *)local_cd8;
        uStack_be0 = *(undefined8 *)(local_cd8 + 2);
        local_aec = 0x3f800000;
        local_b08 = 0x3f800000;
        local_bf8 = 0x3f8000003f800000;
        uStack_bf0 = 0x3f8000003f800000;
        local_b0c = 0x40000000;
        local_b28 = 0x40000000;
        local_c08 = 0x4000000040000000;
        uStack_c00 = 0x4000000040000000;
        local_a38._0_4_ = (float)local_be8;
        local_a38._4_4_ = (float)((ulong)local_be8 >> 0x20);
        uStack_a30._0_4_ = (float)uStack_be0;
        uStack_a30._4_4_ = (float)((ulong)uStack_be0 >> 0x20);
        local_9b8 = (float)local_a38 * 2.0;
        fStack_9b4 = local_a38._4_4_ * 2.0;
        fStack_9b0 = (float)uStack_a30 * 2.0;
        fStack_9ac = uStack_a30._4_4_ * 2.0;
        local_98c = 0x3f800000;
        local_9a8 = 0x3f800000;
        local_9c8 = 0x3f8000003f800000;
        uStack_9c0 = 0x3f8000003f800000;
        local_228 = 0;
        uStack_220 = 0;
        local_978 = 0;
        uStack_970 = 0;
        local_988 = CONCAT44(fStack_9b4,local_9b8);
        uStack_980 = CONCAT44(fStack_9ac,fStack_9b0);
        local_868 = CONCAT44(0.0 - fStack_9b4,0.0 - local_9b8);
        uStack_860._0_4_ = 0.0 - fStack_9b0;
        uStack_860._4_4_ = 0.0 - fStack_9ac;
        local_238 = 0;
        uStack_230 = 0;
        local_8a8 = 0x3f8000003f800000;
        uStack_8a0 = 0x3f8000003f800000;
        local_1d8 = local_868;
        uStack_1d0 = uStack_860;
        local_1e8 = 0x42b0c0a542b0c0a5;
        uStack_1e0 = 0x42b0c0a542b0c0a5;
        auVar10._8_8_ = uStack_860;
        auVar10._0_8_ = local_868;
        auVar9._8_8_ = 0x42b0c0a542b0c0a5;
        auVar9._0_8_ = 0x42b0c0a542b0c0a5;
        auVar16 = minps(auVar10,auVar9);
        local_868 = auVar16._0_8_;
        local_198 = local_868;
        uStack_860 = auVar16._8_8_;
        uStack_190 = uStack_860;
        local_1a8 = 0xc2b0c0a5c2b0c0a5;
        uStack_1a0 = 0xc2b0c0a5c2b0c0a5;
        auVar12._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar12._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar16 = maxps(auVar16,auVar12);
        local_868 = auVar16._0_8_;
        uVar3 = local_868;
        uStack_860 = auVar16._8_8_;
        uVar1 = uStack_860;
        local_6b8 = 0x3fb8aa3b3fb8aa3b;
        uStack_6b0 = 0x3fb8aa3b3fb8aa3b;
        local_6a8._0_4_ = auVar16._0_4_;
        local_6a8._4_4_ = auVar16._4_4_;
        uStack_6a0._0_4_ = auVar16._8_4_;
        uStack_6a0._4_4_ = auVar16._12_4_;
        local_5a8 = CONCAT44(local_6a8._4_4_ * 1.442695,(float)local_6a8 * 1.442695);
        uStack_5a0 = CONCAT44(uStack_6a0._4_4_ * 1.442695,(float)uStack_6a0 * 1.442695);
        local_658 = 0x3f0000003f000000;
        uStack_650 = 0x3f0000003f000000;
        fVar17 = (float)local_6a8 * 1.442695 + 0.5;
        fVar18 = local_6a8._4_4_ * 1.442695 + 0.5;
        fVar19 = (float)uStack_6a0 * 1.442695 + 0.5;
        fVar20 = uStack_6a0._4_4_ * 1.442695 + 0.5;
        local_158 = CONCAT44(fVar18,fVar17);
        uStack_150 = CONCAT44(fVar20,fVar19);
        local_138 = CONCAT44((int)fVar18,(int)fVar17);
        uStack_130 = CONCAT44((int)fVar20,(int)fVar19);
        local_888 = (float)(int)fVar17;
        fStack_884 = (float)(int)fVar18;
        fStack_880 = (float)(int)fVar19;
        fStack_87c = (float)(int)fVar20;
        local_878 = CONCAT44(fStack_884,local_888);
        uStack_870 = CONCAT44(fStack_87c,fStack_880);
        local_f8 = local_878;
        uStack_f0 = uStack_870;
        local_108 = CONCAT44(fVar18,fVar17);
        uStack_100 = CONCAT44(fVar20,fVar19);
        local_8b8 = CONCAT44(-(uint)(fVar18 < fStack_884),-(uint)(fVar17 < local_888));
        uStack_8b0 = CONCAT44(-(uint)(fVar20 < fStack_87c),-(uint)(fVar19 < fStack_880));
        local_b8 = local_8b8;
        uStack_b0 = uStack_8b0;
        local_c8 = 0x3f8000003f800000;
        uStack_c0 = 0x3f8000003f800000;
        local_8b8 = local_8b8 & 0x3f8000003f800000;
        uStack_8b0 = uStack_8b0 & 0x3f8000003f800000;
        local_808 = local_878;
        uStack_800 = uStack_870;
        local_818._0_4_ = (float)local_8b8;
        local_818._4_4_ = (float)(local_8b8 >> 0x20);
        uStack_810._0_4_ = (float)uStack_8b0;
        uStack_810._4_4_ = (float)(uStack_8b0 >> 0x20);
        local_888 = local_888 - (float)local_818;
        fStack_884 = fStack_884 - local_818._4_4_;
        fStack_880 = fStack_880 - (float)uStack_810;
        fStack_87c = fStack_87c - uStack_810._4_4_;
        local_6c8 = CONCAT44(fStack_884,local_888);
        uStack_6c0 = CONCAT44(fStack_87c,fStack_880);
        local_6d8 = 0x3f3180003f318000;
        uStack_6d0 = 0x3f3180003f318000;
        local_878 = CONCAT44(fStack_884 * 0.6933594,local_888 * 0.6933594);
        uStack_870 = CONCAT44(fStack_87c * 0.6933594,fStack_880 * 0.6933594);
        local_6e8 = CONCAT44(fStack_884,local_888);
        uStack_6e0 = CONCAT44(fStack_87c,fStack_880);
        local_6f8 = 0xb95e8083b95e8083;
        uStack_6f0 = 0xb95e8083b95e8083;
        local_828 = local_868;
        uStack_820 = uStack_860;
        local_838 = local_878;
        uStack_830 = uStack_870;
        local_6a8._0_4_ = (float)local_6a8 - local_888 * 0.6933594;
        local_6a8._4_4_ = local_6a8._4_4_ - fStack_884 * 0.6933594;
        uStack_6a0._0_4_ = (float)uStack_6a0 - fStack_880 * 0.6933594;
        uStack_6a0._4_4_ = uStack_6a0._4_4_ - fStack_87c * 0.6933594;
        local_868 = CONCAT44(local_6a8._4_4_,(float)local_6a8);
        uStack_860._0_4_ = (float)uStack_6a0;
        uStack_860._4_4_ = uStack_6a0._4_4_;
        local_848 = local_868;
        uStack_840 = uStack_860;
        local_858 = CONCAT44(fStack_884 * -0.00021219444,local_888 * -0.00021219444);
        uStack_850 = CONCAT44(fStack_87c * -0.00021219444,fStack_880 * -0.00021219444);
        local_6a8._0_4_ = (float)local_6a8 - local_888 * -0.00021219444;
        local_6a8._4_4_ = local_6a8._4_4_ - fStack_884 * -0.00021219444;
        uStack_6a0._0_4_ = (float)uStack_6a0 - fStack_880 * -0.00021219444;
        uStack_6a0._4_4_ = uStack_6a0._4_4_ - fStack_87c * -0.00021219444;
        local_868 = CONCAT44(local_6a8._4_4_,(float)local_6a8);
        uStack_860._0_4_ = (float)uStack_6a0;
        uStack_860._4_4_ = uStack_6a0._4_4_;
        local_718 = local_868;
        uStack_710 = uStack_860;
        local_8c8 = (float)local_6a8 * (float)local_6a8;
        fStack_8c4 = local_6a8._4_4_ * local_6a8._4_4_;
        fStack_8c0 = (float)uStack_6a0 * (float)uStack_6a0;
        fStack_8bc = uStack_6a0._4_4_ * uStack_6a0._4_4_;
        local_728 = 0x3950696739506967;
        uStack_720 = 0x3950696739506967;
        local_738 = local_868;
        uStack_730 = uStack_860;
        local_8d8 = CONCAT44(local_6a8._4_4_ * 0.00019875691,(float)local_6a8 * 0.00019875691);
        uStack_8d0 = CONCAT44(uStack_6a0._4_4_ * 0.00019875691,(float)uStack_6a0 * 0.00019875691);
        local_5c8 = local_8d8;
        uStack_5c0 = uStack_8d0;
        local_5d8 = 0x3ab743ce3ab743ce;
        uStack_5d0 = 0x3ab743ce3ab743ce;
        local_968 = (float)local_6a8 * 0.00019875691 + 0.0013981999;
        fStack_964 = local_6a8._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_960 = (float)uStack_6a0 * 0.00019875691 + 0.0013981999;
        fStack_95c = uStack_6a0._4_4_ * 0.00019875691 + 0.0013981999;
        local_8d8 = CONCAT44(fStack_964,local_968);
        uStack_8d0 = CONCAT44(fStack_95c,fStack_960);
        local_748 = local_8d8;
        uStack_740 = uStack_8d0;
        local_758 = local_868;
        uStack_750 = uStack_860;
        local_968 = local_968 * (float)local_6a8;
        fStack_964 = fStack_964 * local_6a8._4_4_;
        fStack_960 = fStack_960 * (float)uStack_6a0;
        fStack_95c = fStack_95c * uStack_6a0._4_4_;
        local_8d8 = CONCAT44(fStack_964,local_968);
        uStack_8d0 = CONCAT44(fStack_95c,fStack_960);
        local_5e8 = local_8d8;
        uStack_5e0 = uStack_8d0;
        local_5f8 = 0x3c0889083c088908;
        uStack_5f0 = 0x3c0889083c088908;
        local_968 = local_968 + 0.008333452;
        fStack_964 = fStack_964 + 0.008333452;
        fStack_960 = fStack_960 + 0.008333452;
        fStack_95c = fStack_95c + 0.008333452;
        local_8d8 = CONCAT44(fStack_964,local_968);
        uStack_8d0 = CONCAT44(fStack_95c,fStack_960);
        local_768 = local_8d8;
        uStack_760 = uStack_8d0;
        local_778 = local_868;
        uStack_770 = uStack_860;
        local_968 = local_968 * (float)local_6a8;
        fStack_964 = fStack_964 * local_6a8._4_4_;
        fStack_960 = fStack_960 * (float)uStack_6a0;
        fStack_95c = fStack_95c * uStack_6a0._4_4_;
        local_8d8 = CONCAT44(fStack_964,local_968);
        uStack_8d0 = CONCAT44(fStack_95c,fStack_960);
        local_608 = local_8d8;
        uStack_600 = uStack_8d0;
        local_618 = 0x3d2aa9c13d2aa9c1;
        uStack_610 = 0x3d2aa9c13d2aa9c1;
        local_968 = local_968 + 0.041665796;
        fStack_964 = fStack_964 + 0.041665796;
        fStack_960 = fStack_960 + 0.041665796;
        fStack_95c = fStack_95c + 0.041665796;
        local_8d8 = CONCAT44(fStack_964,local_968);
        uStack_8d0 = CONCAT44(fStack_95c,fStack_960);
        local_788 = local_8d8;
        uStack_780 = uStack_8d0;
        local_798 = local_868;
        uStack_790 = uStack_860;
        local_968 = local_968 * (float)local_6a8;
        fStack_964 = fStack_964 * local_6a8._4_4_;
        fStack_960 = fStack_960 * (float)uStack_6a0;
        fStack_95c = fStack_95c * uStack_6a0._4_4_;
        local_8d8 = CONCAT44(fStack_964,local_968);
        uStack_8d0 = CONCAT44(fStack_95c,fStack_960);
        local_628 = local_8d8;
        uStack_620 = uStack_8d0;
        local_638 = 0x3e2aaaaa3e2aaaaa;
        uStack_630 = 0x3e2aaaaa3e2aaaaa;
        local_968 = local_968 + 0.16666666;
        fStack_964 = fStack_964 + 0.16666666;
        fStack_960 = fStack_960 + 0.16666666;
        fStack_95c = fStack_95c + 0.16666666;
        local_8d8 = CONCAT44(fStack_964,local_968);
        uStack_8d0 = CONCAT44(fStack_95c,fStack_960);
        local_7a8 = local_8d8;
        uStack_7a0 = uStack_8d0;
        local_7b8 = local_868;
        uStack_7b0 = uStack_860;
        local_968 = local_968 * (float)local_6a8;
        fStack_964 = fStack_964 * local_6a8._4_4_;
        fStack_960 = fStack_960 * (float)uStack_6a0;
        fStack_95c = fStack_95c * uStack_6a0._4_4_;
        local_8d8 = CONCAT44(fStack_964,local_968);
        uStack_8d0 = CONCAT44(fStack_95c,fStack_960);
        local_648 = local_8d8;
        uStack_640 = uStack_8d0;
        local_968 = local_968 + 0.5;
        fStack_964 = fStack_964 + 0.5;
        fStack_960 = fStack_960 + 0.5;
        fStack_95c = fStack_95c + 0.5;
        local_8d8 = CONCAT44(fStack_964,local_968);
        uStack_8d0 = CONCAT44(fStack_95c,fStack_960);
        local_7c8 = local_8d8;
        uStack_7c0 = uStack_8d0;
        local_7d8 = CONCAT44(fStack_8c4,local_8c8);
        uStack_7d0 = CONCAT44(fStack_8bc,fStack_8c0);
        local_968 = local_968 * local_8c8;
        fStack_964 = fStack_964 * fStack_8c4;
        fStack_960 = fStack_960 * fStack_8c0;
        fStack_95c = fStack_95c * fStack_8bc;
        local_8d8 = CONCAT44(fStack_964,local_968);
        uStack_8d0 = CONCAT44(fStack_95c,fStack_960);
        local_668 = local_8d8;
        uStack_660 = uStack_8d0;
        local_678 = local_868;
        uStack_670 = uStack_860;
        local_968 = local_968 + (float)local_6a8;
        fStack_964 = fStack_964 + local_6a8._4_4_;
        fStack_960 = fStack_960 + (float)uStack_6a0;
        fStack_95c = fStack_95c + uStack_6a0._4_4_;
        local_8d8 = CONCAT44(fStack_964,local_968);
        uStack_8d0 = CONCAT44(fStack_95c,fStack_960);
        local_688 = local_8d8;
        uStack_680 = uStack_8d0;
        local_698 = 0x3f8000003f800000;
        uStack_690 = 0x3f8000003f800000;
        local_968 = local_968 + 1.0;
        fStack_964 = fStack_964 + 1.0;
        fStack_960 = fStack_960 + 1.0;
        fStack_95c = fStack_95c + 1.0;
        local_8d8 = CONCAT44(fStack_964,local_968);
        uStack_8d0 = CONCAT44(fStack_95c,fStack_960);
        local_168 = CONCAT44(fStack_884,local_888);
        uStack_160 = CONCAT44(fStack_87c,fStack_880);
        local_78 = CONCAT44((int)fStack_884,(int)local_888);
        uStack_70 = CONCAT44((int)fStack_87c,(int)fStack_880);
        local_88 = 0x7f0000007f;
        uStack_80 = 0x7f0000007f;
        iVar14 = (int)local_888 + 0x7f;
        fStack_894 = (float)((int)fStack_884 + 0x7f);
        fStack_890 = (float)((int)fStack_880 + 0x7f);
        fStack_88c = (float)((int)fStack_87c + 0x7f);
        local_38 = CONCAT44(fStack_894,iVar14);
        uStack_30 = CONCAT44(fStack_88c,fStack_890);
        local_3c = 0x17;
        local_898 = (float)(iVar14 * 0x800000);
        local_8e8 = CONCAT44(fStack_894,local_898);
        uStack_8e0 = CONCAT44(fStack_88c,fStack_890);
        local_7e8 = local_8d8;
        uStack_7e0 = uStack_8d0;
        local_968 = local_968 * local_898;
        fStack_964 = fStack_964 * fStack_894;
        fStack_960 = fStack_960 * fStack_890;
        fStack_95c = fStack_95c * fStack_88c;
        local_8d8 = CONCAT44(fStack_964,local_968);
        uStack_8d0 = CONCAT44(fStack_95c,fStack_960);
        local_928 = local_8d8;
        uStack_920 = uStack_8d0;
        local_968 = local_968 + 1.0;
        fStack_964 = fStack_964 + 1.0;
        fStack_960 = fStack_960 + 1.0;
        fStack_95c = fStack_95c + 1.0;
        auVar4._8_8_ = 0x3f8000003f800000;
        auVar4._0_8_ = 0x3f8000003f800000;
        auVar16._4_4_ = fStack_964;
        auVar16._0_4_ = local_968;
        auVar16._8_4_ = fStack_960;
        auVar16._12_4_ = fStack_95c;
        _local_a58 = divps(auVar4,auVar16);
        local_ab8 = (float)local_a58._0_4_ * 2.0;
        fStack_ab4 = (float)local_a58._4_4_ * 2.0;
        fStack_ab0 = fStack_a50 * 2.0;
        fStack_aac = fStack_a4c * 2.0;
        local_d38 = CONCAT44(fStack_ab4 - 1.0,local_ab8 - 1.0);
        _fStack_d30 = CONCAT44(fStack_aac - 1.0,fStack_ab0 - 1.0);
        local_b90 = local_cd8;
        local_ba8 = local_d38;
        uStack_ba0 = _fStack_d30;
        *(undefined8 *)local_cd8 = local_d38;
        *(undefined8 *)(local_cd8 + 2) = _fStack_d30;
        local_cd8 = local_cd8 + 4;
        uStack_b24 = local_b28;
        uStack_b20 = local_b28;
        uStack_b1c = local_b28;
        uStack_b04 = local_b08;
        uStack_b00 = local_b08;
        uStack_afc = local_b08;
        local_ac8 = local_bf8;
        uStack_ac0 = uStack_bf0;
        local_a68 = local_c08;
        uStack_a60 = uStack_c00;
        local_a48 = local_c08;
        uStack_a40 = uStack_c00;
        local_a38 = local_be8;
        uStack_a30 = uStack_be0;
        uStack_9a4 = local_9a8;
        uStack_9a0 = local_9a8;
        uStack_99c = local_9a8;
        local_958 = local_9c8;
        uStack_950 = uStack_9c0;
        local_918 = local_9c8;
        uStack_910 = uStack_9c0;
        local_818 = local_8b8;
        uStack_810 = uStack_8b0;
        local_7f8 = local_8e8;
        uStack_7f0 = uStack_8e0;
        local_708 = local_718;
        uStack_700 = uStack_710;
        local_6a8 = uVar3;
        uStack_6a0 = uVar1;
        local_5b8 = local_658;
        uStack_5b0 = uStack_650;
        local_18 = local_8e8;
        uStack_10 = uStack_8e0;
      }
      for (; in_stack_fffffffffffff2dc < local_c48;
          in_stack_fffffffffffff2dc = in_stack_fffffffffffff2dc + 1) {
        dVar15 = std::tanh((double)(ulong)(uint)*local_cd8);
        *local_cd8 = SUB84(dVar15,0);
        local_cd8 = local_cd8 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int TanH_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = tanh_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = tanh_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanh(*ptr);
            ptr++;
        }
    }

    return 0;
}